

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_computer.h
# Opt level: O0

void __thiscall
directed_flag_complex_computer::store_coboundaries_in_cache_t::operator()
          (store_coboundaries_in_cache_t *this,vertex_index_t *first_vertex,int size)

{
  ulong uVar1;
  entry_t e;
  bool bVar2;
  ushort uVar3;
  ostream *poVar4;
  reference pvVar5;
  runtime_error *this_00;
  pointer ppVar6;
  int in_EDX;
  vertex_index_t *in_RSI;
  int *in_RDI;
  string err;
  iterator pair;
  short thread_index;
  directed_flag_complex_coboundary_cell_t *cb;
  int b;
  size_t vertex_offset;
  int j_1;
  size_t bits;
  size_t offset;
  int i;
  int j;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vertex_offsets;
  directed_flag_complex_cell_t cell;
  entry_t in_stack_fffffffffffffe78;
  index_t in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  directed_flag_complex_cell_t *in_stack_fffffffffffffe88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe90;
  ulong local_138;
  ulong in_stack_fffffffffffffed0;
  unsigned_short dim;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 uVar7;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [32];
  _Node_iterator_base<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_true> local_c8;
  _Node_iterator_base<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_true> local_c0;
  short local_b2;
  undefined8 *local_b0 [4];
  undefined8 **local_90;
  int local_84;
  long local_80;
  int local_74;
  ulong local_70;
  ulong local_68;
  uint local_60;
  ulong local_50;
  int local_44;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  directed_flag_complex_cell_t local_28;
  int local_14;
  vertex_index_t *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  if (((*(byte *)(in_RDI + 1) & 1) != 0) && ((*in_RDI + 1) % 10000 == 0)) {
    poVar4 = std::operator<<((ostream *)&std::cout,"\x1b[K");
    poVar4 = std::operator<<(poVar4,"dimension ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_RDI[2]);
    poVar4 = std::operator<<(poVar4,": computed ca. ");
    std::ostream::operator<<(poVar4,*(long *)(in_RDI + 0xe) * (long)(*in_RDI + 1));
    if (*(long *)(in_RDI + 0xc) != 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"/");
      std::ostream::operator<<(poVar4,*(ulong *)(in_RDI + 0xc));
    }
    poVar4 = std::operator<<((ostream *)&std::cout," coboundaries");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
    std::operator<<(poVar4,"\r");
  }
  directed_flag_complex_cell_t::directed_flag_complex_cell_t(&local_28,local_10);
  compressed_sparse_matrix<entry_t>::append_column
            ((compressed_sparse_matrix<entry_t> *)
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1ad00e);
  for (local_44 = 0; local_44 < local_14; local_44 = local_44 + 1) {
    local_50 = (ulong)(local_10[local_44] >> 6);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               (value_type_conflict3 *)in_stack_fffffffffffffe78);
  }
  local_60 = 0;
  do {
    if (local_14 < (int)local_60) {
      *in_RDI = *in_RDI + 1;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_fffffffffffffe90)
      ;
      return;
    }
    for (local_68 = 0; local_68 < *(ulong *)(*(long *)(in_RDI + 6) + 0xa0); local_68 = local_68 + 1)
    {
      local_74 = 0;
      for (local_70 = 0xffffffffffffffff; uVar7 = local_70 != 0 && local_74 < local_14,
          local_70 != 0 && local_74 < local_14; local_70 = local_138 & local_70) {
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_40,(long)local_74);
        if (*pvVar5 == local_68) {
          in_stack_fffffffffffffed0 = (ulong)local_10[local_74];
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (&local_40,(long)local_74);
          local_70 = (1L << ((byte)in_stack_fffffffffffffed0 & 0x3f) ^ 0xffffffffffffffffU) &
                     local_70;
        }
        if (local_74 < (int)local_60) {
          local_138 = directed_graph_t::get_outgoing_chunk
                                ((directed_graph_t *)
                                 CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                 in_stack_fffffffffffffe78._6_2_,0x1ad1d8);
        }
        else {
          local_138 = directed_graph_t::get_incoming_chunk
                                ((directed_graph_t *)
                                 CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                 in_stack_fffffffffffffe78._6_2_,0x1ad209);
        }
        local_74 = local_74 + 1;
      }
      local_80 = local_68 << 6;
      while (local_70 != 0) {
        local_84 = 0;
        for (uVar1 = local_70; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x8000000000000000) {
          local_84 = local_84 + 1;
        }
        local_70 = local_70 & ~(1L << ((ulong)(byte)local_84 & 0x3f));
        directed_flag_complex_cell_t::insert_vertex
                  (in_stack_fffffffffffffe88,
                   CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   in_stack_fffffffffffffe78._6_2_);
        local_90 = local_b0;
        uVar3 = (*(code *)*local_b0[0])(local_90,0);
        local_b2 = (short)((ulong)uVar3 % *(ulong *)(in_RDI + 0xe));
        std::
        vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
        ::operator[](*(vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
                       **)(in_RDI + 8),(long)local_b2);
        local_c0._M_cur =
             (__node_type *)
             std::
             unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
             ::find((unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
                     *)in_stack_fffffffffffffe78,(key_type *)0x1ad33d);
        std::
        vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
        ::operator[](*(vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
                       **)(in_RDI + 8),(long)local_b2);
        local_c8._M_cur =
             (__node_type *)
             std::
             unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
             ::end((unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
                    *)in_stack_fffffffffffffe78);
        bVar2 = std::__detail::operator==(&local_c0,&local_c8);
        dim = (unsigned_short)(in_stack_fffffffffffffed0 >> 0x30);
        if (bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_e8,"Could not find coboundary ",&local_e9);
          std::allocator<char>::~allocator((allocator<char> *)&local_e9);
          directed_flag_complex_cell_t::to_string_abi_cxx11_
                    ((directed_flag_complex_cell_t *)CONCAT17(uVar7,in_stack_fffffffffffffed8),dim);
          std::__cxx11::string::operator+=(local_e8,local_110);
          std::__cxx11::string::~string(local_110);
          std::__cxx11::string::operator+=(local_e8,".\n");
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,local_e8);
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        in_stack_fffffffffffffe88 = *(directed_flag_complex_cell_t **)(in_RDI + 4);
        ppVar6 = std::__detail::
                 _Node_iterator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_false,_true>
                               *)0x1ad50d);
        in_stack_fffffffffffffe90 =
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)ppVar6->second;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  (*(vector<unsigned_long,_std::allocator<unsigned_long>_> **)(in_RDI + 10),
                   (long)local_b2);
        if ((local_60 & 1) == 0) {
          in_stack_fffffffffffffe84 = 1;
        }
        else {
          in_stack_fffffffffffffe84 = (short)in_RDI[0x10] + -1;
        }
        in_stack_fffffffffffffe78 =
             make_entry(in_stack_fffffffffffffe78._4_4_,in_stack_fffffffffffffe78.index._2_2_);
        e._4_4_ = in_stack_fffffffffffffe84;
        e.index = in_stack_fffffffffffffe80;
        compressed_sparse_matrix<entry_t>::push_back
                  ((compressed_sparse_matrix<entry_t> *)in_stack_fffffffffffffe78,e);
      }
    }
    local_60 = local_60 + 1;
  } while( true );
}

Assistant:

void operator()(vertex_index_t* first_vertex, int size) {
#ifdef INDICATE_PROGRESS
		if (is_first && (current_index + 1) % 10000 == 0) {
			std::cout << "\033[K"
			          << "dimension " << current_dimension << ": computed ca. " << nb_threads * (current_index + 1);
			if (total_cell_number > 0) std::cout << "/" << total_cell_number;
			std::cout << " coboundaries" << std::flush << "\r";
		}
#endif
		directed_flag_complex_cell_t cell(first_vertex);
		coboundary_matrix.append_column();

		std::vector<size_t> vertex_offsets;
		for (int j = 0; j < size; j++) vertex_offsets.push_back(first_vertex[j] >> 6);

		for (int i = 0; i <= size; i++) {
			// Check intersections in chunks of 64
			for (size_t offset = 0; offset < graph.incidence_row_length; offset++) {
				size_t bits = -1; // All bits set

				for (int j = 0; bits > 0 && j < size; j++) {
					// Remove the vertices already making up the cellk
					if (vertex_offsets[j] == offset) bits &= ~(ONE_ << (first_vertex[j] - (vertex_offsets[j] << 6)));

					// Intersect with the outgoing/incoming edges of the current
					// vertex
					bits &= j < i ? graph.get_outgoing_chunk(first_vertex[j], offset)
					              : graph.get_incoming_chunk(first_vertex[j], offset);
				}

				size_t vertex_offset = offset << 6;
				while (bits > 0) {
					// Get the least significant non-zero bit
					auto b = __builtin_ctzl(bits);

					// Unset this bit
					bits &= ~(ONE_ << b);

					// Now insert the appropriate vertex at this position
					const auto& cb = cell.insert_vertex(i, vertex_index_t(vertex_offset + b));
					const short thread_index = cb.vertex(0) % nb_threads;
					auto pair = cell_hash[thread_index].find(cb);
					if (pair == cell_hash[thread_index].end()) {
						std::string err = "Could not find coboundary ";
						err += cb.to_string(current_dimension + 1);
						err += ".\n";
						throw std::runtime_error(err);
					}
					coboundary_matrix.push_back(
					    make_entry(index_t(pair->second + cell_hash_offsets[thread_index]), i & 1 ? -1 + modulus : 1));
				}
			}
		}

		current_index++;
	}